

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,int>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
                    *handler)

{
  wchar_t wVar1;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *pfVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  char *message;
  error_handler *this;
  uint uVar5;
  
  wVar1 = *begin;
  if ((wVar1 == L'}') || (wVar1 == L':')) {
    pfVar2 = handler->handler;
    this = (error_handler *)&pfVar2->context_;
    uVar5 = (pfVar2->context_).next_arg_id_;
    if ((int)uVar5 < 0) {
      error_handler::on_error(this,"cannot switch from manual to automatic argument indexing");
      uVar5 = 0;
    }
    else {
      (pfVar2->context_).next_arg_id_ = uVar5 + 1;
    }
    pfVar2->arg_id_ = uVar5;
joined_r0x001d40fe:
    if (uVar5 == 0) {
      return begin;
    }
    message = "argument index out of range";
  }
  else {
    if ((uint)(wVar1 + L'\xffffffd0') < 10) {
      if (wVar1 == L'0') {
        pwVar4 = begin + 1;
        uVar5 = 0;
      }
      else {
        pwVar3 = begin + 1;
        uVar5 = 0;
        do {
          if (0xccccccc < uVar5) {
            uVar5 = 0x80000000;
            pwVar4 = pwVar3 + -1;
            break;
          }
          uVar5 = (pwVar3[-1] + uVar5 * 10) - 0x30;
          pwVar4 = pwVar3;
          if (pwVar3 == end) break;
          begin = begin + 1;
          wVar1 = *pwVar3;
          pwVar3 = pwVar3 + 1;
          pwVar4 = begin;
        } while ((uint)(wVar1 + L'\xffffffd0') < 10);
        if ((int)uVar5 < 0) {
          error_handler::on_error((error_handler *)&handler->handler->context_,"number is too big");
        }
      }
      begin = pwVar4;
      if ((pwVar4 != end) && ((*pwVar4 == L':' || (*pwVar4 == L'}')))) {
        pfVar2 = handler->handler;
        pfVar2->arg_id_ = uVar5;
        this = (error_handler *)&pfVar2->context_;
        if ((pfVar2->context_).next_arg_id_ < 1) {
          (pfVar2->context_).next_arg_id_ = -1;
        }
        else {
          error_handler::on_error(this,"cannot switch from automatic to manual argument indexing");
        }
        uVar5 = pfVar2->arg_id_;
        goto joined_r0x001d40fe;
      }
    }
    else if ((wVar1 == L'_') || ((uint)((wVar1 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      pwVar3 = begin + 1;
      do {
        pwVar4 = pwVar3;
        if (pwVar4 == end) {
          return pwVar4;
        }
        wVar1 = *pwVar4;
        pwVar3 = pwVar4 + 1;
      } while ((((uint)(wVar1 + L'\xffffffd0') < 10) || (wVar1 == L'_')) ||
              ((uint)((wVar1 & 0xffffffdfU) - 0x41U) < 0x1a));
      return pwVar4;
    }
    this = (error_handler *)&handler->handler->context_;
    message = "invalid format string";
  }
  error_handler::on_error(this,message);
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}